

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadBlif(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Abc_Ntk_t *p;
  char *pcVar5;
  Abc_Ntk_t *pTemp;
  int c;
  int fSaveNames;
  int fUseNewParser;
  int fCheck;
  int fReadAsAig;
  char *pFileName;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fSaveNames = 1;
  bVar1 = false;
  bVar2 = true;
  bVar3 = false;
  Extra_UtilGetoptReset();
  while (iVar4 = Extra_UtilGetopt(argc,argv,"nmach"), iVar4 != -1) {
    switch(iVar4) {
    case 0x61:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    default:
      goto LAB_00337c0c;
    case 99:
      fSaveNames = fSaveNames ^ 1;
      break;
    case 0x68:
      goto LAB_00337c0c;
    case 0x6d:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x6e:
      bVar2 = (bool)(bVar2 ^ 1);
    }
  }
  if (argc == globalUtilOptind + 1) {
    pcVar5 = argv[globalUtilOptind];
    if (bVar1) {
      pFileName = (char *)Io_ReadBlifAsAig(pcVar5,fSaveNames);
    }
    else if (bVar2) {
      pFileName = (char *)Io_Read(pcVar5,IO_FILE_BLIF,fSaveNames,0);
    }
    else {
      p = Io_ReadBlif(pcVar5,fSaveNames);
      if (p == (Abc_Ntk_t *)0x0) {
        return 1;
      }
      if (bVar3) {
        Abc_NtkStartNameIds(p);
      }
      pFileName = (char *)Abc_NtkToLogic(p);
      if (bVar3) {
        Abc_NtkTransferNameIds(p,(Abc_Ntk_t *)pFileName);
      }
      Abc_NtkDelete(p);
    }
    if (pFileName == (char *)0x0) {
      pAbc_local._4_4_ = 1;
    }
    else {
      Abc_FrameReplaceCurrentNetwork(pAbc,(Abc_Ntk_t *)pFileName);
      Abc_FrameClearVerifStatus(pAbc);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
LAB_00337c0c:
    fprintf((FILE *)pAbc->Err,"usage: read_blif [-nmach] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         reads the network in binary BLIF format\n");
    fprintf((FILE *)pAbc->Err,"\t         (if this command does not work, try \"read\")\n");
    pcVar5 = "no";
    if (!bVar2) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-n     : toggle using old BLIF parser without hierarchy support [default = %s]\n",
            pcVar5);
    pcVar5 = "no";
    if (bVar3) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-m     : toggle saving original circuit names into a file [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (bVar1) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-a     : toggle creating AIG while reading the file [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (fSaveNames != 0) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",
            pcVar5);
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadBlif( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int fReadAsAig;
    int fCheck;
    int fUseNewParser;
    int fSaveNames;
    int c;
    extern Abc_Ntk_t * Io_ReadBlifAsAig( char * pFileName, int fCheck );

    fCheck = 1;
    fReadAsAig = 0;
    fUseNewParser = 1;
    fSaveNames = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nmach" ) ) != EOF )
    {
        switch ( c )
        {
            case 'n':
                fUseNewParser ^= 1;
                break;
            case 'm':
                fSaveNames ^= 1;
                break;
            case 'a':
                fReadAsAig ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    if ( fReadAsAig )
        pNtk = Io_ReadBlifAsAig( pFileName, fCheck );
    else if ( fUseNewParser )
        pNtk = Io_Read( pFileName, IO_FILE_BLIF, fCheck, 0 );
    else
    {
        Abc_Ntk_t * pTemp;
        pNtk = Io_ReadBlif( pFileName, fCheck );
        if ( pNtk == NULL )
            return 1;
        if ( fSaveNames )
            Abc_NtkStartNameIds( pNtk );
        pNtk = Abc_NtkToLogic( pTemp = pNtk );
        if ( fSaveNames )
            Abc_NtkTransferNameIds( pTemp, pNtk );
        Abc_NtkDelete( pTemp );
    }

    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_blif [-nmach] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in binary BLIF format\n" );
    fprintf( pAbc->Err, "\t         (if this command does not work, try \"read\")\n" );
    fprintf( pAbc->Err, "\t-n     : toggle using old BLIF parser without hierarchy support [default = %s]\n", !fUseNewParser? "yes":"no" );
    fprintf( pAbc->Err, "\t-m     : toggle saving original circuit names into a file [default = %s]\n", fSaveNames? "yes":"no" );
    fprintf( pAbc->Err, "\t-a     : toggle creating AIG while reading the file [default = %s]\n", fReadAsAig? "yes":"no" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}